

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O2

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate),
     iVar2 != 0)) {
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  puVar8 = (uint *)(data + n);
  uVar13 = ~crc;
  puVar3 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar12 = (uint *)data;
  if (puVar3 <= puVar8) {
    for (; puVar12 = puVar3, (uint *)data != puVar3; data = (char *)((long)data + 1)) {
      uVar13 = uVar13 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*(uint *)data ^ uVar13 & 0xff) * 4);
    }
  }
  if (0xf < (long)puVar8 - (long)puVar12) {
    uVar13 = uVar13 ^ *puVar12;
    uVar11 = puVar12[1];
    uVar5 = puVar12[2];
    uVar9 = puVar12[3];
    lVar4 = (long)puVar8 - (long)puVar12;
    puVar3 = puVar12;
    while( true ) {
      puVar12 = puVar3 + 4;
      lVar4 = lVar4 + -0x10;
      if (lVar4 < 0x10) break;
      uVar13 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar13 & 0xff) * 4)
               ^ *puVar12 ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar13 >> 0x18) * 4
                        );
      uVar11 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar11 & 0xff) * 4)
               ^ puVar3[5] ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar11 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar11 >> 0xe & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar11 >> 0x18) * 4
                        );
      uVar5 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4) ^
              puVar3[6] ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4);
      uVar9 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar9 & 0xff) * 4) ^
              puVar3[7] ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar9 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar9 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar9 >> 0x18) * 4);
      puVar3 = puVar12;
    }
    for (; 3 < lVar4; lVar4 = lVar4 + -4) {
      uVar10 = uVar13 & 0xff;
      uVar1 = *puVar12;
      uVar6 = uVar13 >> 8;
      uVar7 = uVar13 >> 0xe;
      uVar14 = uVar13 >> 0x18;
      puVar12 = puVar12 + 1;
      uVar13 = uVar11;
      uVar11 = uVar5;
      uVar5 = uVar9;
      uVar9 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar10 * 4) ^ uVar1 ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 + (ulong)(uVar6 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar7 & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar14 * 4);
    }
    lVar4 = 4;
    while (bVar15 = lVar4 != 0, lVar4 = lVar4 + -1, bVar15) {
      uVar13 = uVar13 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar13 & 0xff) * 4);
    }
    uVar13 = uVar13 ^ uVar11;
    lVar4 = 4;
    while (bVar15 = lVar4 != 0, lVar4 = lVar4 + -1, bVar15) {
      uVar13 = uVar13 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar13 & 0xff) * 4);
    }
    uVar13 = uVar13 ^ uVar5;
    lVar4 = 4;
    while (bVar15 = lVar4 != 0, lVar4 = lVar4 + -1, bVar15) {
      uVar13 = uVar13 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar13 & 0xff) * 4);
    }
    uVar13 = uVar13 ^ uVar9;
    lVar4 = 4;
    while (bVar15 = lVar4 != 0, lVar4 = lVar4 + -1, bVar15) {
      uVar13 = uVar13 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar13 & 0xff) * 4);
    }
  }
  for (; puVar12 != puVar8; puVar12 = (uint *)((long)puVar12 + 1)) {
    uVar13 = uVar13 >> 8 ^
             *(uint *)((anonymous_namespace)::kByteExtensionTable +
                      (ulong)((uint)(byte)*puVar12 ^ uVar13 & 0xff) * 4);
  }
  return ~uVar13;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}